

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_tet_quality(REF_NODE ref_node,REF_INT *nodes,REF_DBL *quality)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  REF_DBL *pRVar5;
  uint uVar6;
  undefined8 uVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  REF_DBL RVar17;
  undefined1 auVar18 [16];
  double dVar19;
  REF_DBL det;
  REF_DBL volume;
  REF_DBL det_1;
  REF_DBL e5 [3];
  REF_DBL e4 [3];
  REF_DBL e3 [3];
  REF_DBL e2 [3];
  REF_DBL jac [9];
  REF_DBL l5;
  REF_DBL l4;
  REF_DBL l3;
  REF_DBL l2;
  REF_DBL l1;
  REF_DBL l0;
  double local_388 [4];
  double local_368;
  undefined8 uStack_360;
  double local_358;
  undefined8 uStack_350;
  double local_348 [4];
  double local_328;
  double local_320;
  double local_318;
  double local_310;
  double local_308;
  double local_300;
  double local_2f8;
  double local_2f0;
  double local_2e8;
  double local_2e0;
  double local_2d8;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  double local_2b8 [4];
  double local_298 [4];
  double local_278 [4];
  double local_258 [4];
  double local_238;
  undefined8 uStack_230;
  double local_228;
  undefined8 uStack_220;
  double local_218;
  undefined8 uStack_210;
  double local_208;
  double dStack_200;
  double local_1f8;
  undefined8 uStack_1f0;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  undefined8 uStack_1d0;
  double local_1c8;
  undefined8 uStack_1c0;
  double local_1b8;
  undefined8 uStack_1b0;
  double local_1a8;
  undefined8 uStack_1a0;
  REF_DBL local_198 [10];
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118 [31];
  
  if (ref_node->tet_quality == 2) {
    uVar6 = ref_node_tet_vol(ref_node,nodes,&local_2c8);
    if (uVar6 == 0) {
      if (local_2c8 <= ref_node->min_volume) {
        RVar17 = local_2c8 - ref_node->min_volume;
LAB_001298c2:
        *quality = RVar17;
        return 0;
      }
      iVar4 = *nodes;
      pRVar5 = ref_node->real;
      lVar8 = 0;
      do {
        local_118[lVar8 + 0x18] = pRVar5[iVar4 * 0xf + 9 + (int)lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 6);
      iVar4 = nodes[1];
      lVar8 = 0;
      do {
        local_118[lVar8 + 0x12] = pRVar5[iVar4 * 0xf + 9 + (int)lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 6);
      iVar4 = nodes[2];
      lVar8 = 0;
      do {
        local_118[lVar8 + 0xc] = pRVar5[iVar4 * 0xf + 9 + (int)lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 6);
      iVar4 = nodes[3];
      lVar8 = 0;
      do {
        local_118[lVar8 + 6] = pRVar5[iVar4 * 0xf + 9 + (int)lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 6);
      local_358 = local_2c8;
      uStack_350 = 0;
      lVar8 = 0;
      do {
        local_118[lVar8] =
             (local_118[lVar8 + 0x18] + local_118[lVar8 + 0x12] + local_118[lVar8 + 0xc] +
             local_118[lVar8 + 6]) * 0.25;
        local_118[lVar8 + 1] =
             (local_118[lVar8 + 0x19] + local_118[lVar8 + 0x13] + local_118[lVar8 + 0xd] +
             local_118[lVar8 + 7]) * 0.25;
        lVar8 = lVar8 + 2;
      } while (lVar8 != 6);
      uVar6 = ref_matrix_exp_m(local_118,&local_148);
      if (uVar6 == 0) {
        uVar6 = ref_matrix_jacob_m(&local_148,local_198);
        if (uVar6 == 0) {
          pRVar5 = ref_node->real;
          iVar4 = nodes[1];
          iVar1 = *nodes;
          lVar8 = 0;
          do {
            local_388[lVar8] = pRVar5[(long)iVar4 * 0xf + lVar8] - pRVar5[(long)iVar1 * 0xf + lVar8]
            ;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          iVar2 = nodes[2];
          lVar8 = 0;
          do {
            local_348[lVar8] = pRVar5[(long)iVar2 * 0xf + lVar8] - pRVar5[(long)iVar1 * 0xf + lVar8]
            ;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          iVar3 = nodes[3];
          lVar8 = 0;
          do {
            local_258[lVar8] = pRVar5[(long)iVar3 * 0xf + lVar8] - pRVar5[(long)iVar1 * 0xf + lVar8]
            ;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          lVar8 = 0;
          do {
            local_278[lVar8] = pRVar5[(long)iVar2 * 0xf + lVar8] - pRVar5[(long)iVar4 * 0xf + lVar8]
            ;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          lVar8 = 0;
          do {
            local_298[lVar8] = pRVar5[(long)iVar3 * 0xf + lVar8] - pRVar5[(long)iVar4 * 0xf + lVar8]
            ;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          lVar8 = 0;
          do {
            local_2b8[lVar8] = pRVar5[(long)iVar3 * 0xf + lVar8] - pRVar5[(long)iVar2 * 0xf + lVar8]
            ;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          local_1e8 = local_388[0];
          dStack_1e0 = local_388[1];
          local_1d8 = local_148;
          uStack_1d0 = 0;
          local_1b8 = local_140;
          uStack_1b0 = 0;
          local_208 = local_388[1];
          dStack_200 = local_388[2];
          local_368 = local_138;
          uStack_360 = 0;
          local_1f8 = local_388[2];
          uStack_1f0 = 0;
          local_1c8 = local_130;
          uStack_1c0 = 0;
          local_1a8 = local_128;
          uStack_1a0 = 0;
          local_228 = local_348[0];
          uStack_220 = 0;
          local_238 = local_348[1];
          uStack_230 = 0;
          local_218 = local_348[2];
          uStack_210 = 0;
          local_320 = local_258[0];
          local_328 = local_258[1];
          local_318 = local_258[2];
          local_308 = local_278[0];
          local_310 = local_278[1];
          local_300 = local_278[2];
          local_2f0 = local_298[0];
          local_2f8 = local_298[1];
          local_2e8 = local_298[2];
          local_2d8 = local_2b8[0];
          local_2e0 = local_2b8[1];
          local_2d0 = local_2b8[2];
          uVar6 = ref_matrix_det_m(&local_148,&local_2c0);
          if (uVar6 == 0) {
            dVar19 = (local_120 * local_2d0 + local_368 * local_2d8 + local_1a8 * local_2e0) *
                     local_2d0 +
                     (local_368 * local_2d0 + local_1d8 * local_2d8 + local_1b8 * local_2e0) *
                     local_2d8 +
                     (local_1a8 * local_2d0 + local_1b8 * local_2d8 + local_1c8 * local_2e0) *
                     local_2e0 +
                     (local_120 * local_2e8 + local_368 * local_2f0 + local_1a8 * local_2f8) *
                     local_2e8 +
                     (local_368 * local_2e8 + local_1d8 * local_2f0 + local_1b8 * local_2f8) *
                     local_2f0 +
                     (local_1a8 * local_2e8 + local_1b8 * local_2f0 + local_1c8 * local_2f8) *
                     local_2f8 +
                     (local_120 * local_300 + local_368 * local_308 + local_1a8 * local_310) *
                     local_300 +
                     (local_368 * local_300 + local_1d8 * local_308 + local_1b8 * local_310) *
                     local_308 +
                     (local_1a8 * local_300 + local_1b8 * local_308 + local_1c8 * local_310) *
                     local_310 +
                     (local_120 * local_318 + local_368 * local_320 + local_1a8 * local_328) *
                     local_318 +
                     (local_368 * local_318 + local_1d8 * local_320 + local_1b8 * local_328) *
                     local_320 +
                     (local_1a8 * local_318 + local_1b8 * local_320 + local_1c8 * local_328) *
                     local_328 +
                     (local_120 * local_218 + local_368 * local_228 + local_1a8 * local_238) *
                     local_218 +
                     (local_368 * local_218 + local_1d8 * local_228 + local_1b8 * local_238) *
                     local_228 +
                     (local_1a8 * local_218 + local_1b8 * local_228 + local_1c8 * local_238) *
                     local_238 +
                     (local_120 * local_1f8 + local_368 * local_1e8 + local_1a8 * local_208) *
                     local_1f8 +
                     (local_368 * local_1f8 + local_1d8 * local_1e8 + local_1b8 * local_208) *
                     local_1e8 +
                     (local_1a8 * local_1f8 + local_1b8 * local_1e8 + local_1c8 * local_208) *
                     local_208;
            if (local_2c0 < 0.0) {
              local_2c0 = sqrt(local_2c0);
            }
            else {
              local_2c0 = SQRT(local_2c0);
            }
            dVar13 = pow(local_358 * local_2c0,0.6666666666666666);
            auVar14._0_8_ = dVar19 * 1e+20;
            auVar14._8_8_ = dVar13;
            auVar15._0_8_ = -auVar14._0_8_;
            auVar15._8_8_ = -dVar13;
            auVar16 = maxpd(auVar14,auVar15);
            uVar10 = -(ulong)(auVar16._8_8_ < auVar16._0_8_);
            RVar17 = (REF_DBL)(~uVar10 & 0xbff0000000000000 |
                              (ulong)((dVar13 * 24.9610058766228) / dVar19) & uVar10);
            goto LAB_001298c2;
          }
          pcVar9 = "det(mavg)";
          uVar7 = 0x78d;
        }
        else {
          pcVar9 = "jac";
          uVar7 = 0x774;
        }
      }
      else {
        pcVar9 = "exp";
        uVar7 = 0x773;
      }
    }
    else {
      pcVar9 = "vol";
      uVar7 = 0x767;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar7,
           "ref_node_tet_jac_quality",(ulong)uVar6,pcVar9);
    pcVar9 = "jac";
    uVar7 = 0x7a4;
  }
  else {
    if (ref_node->tet_quality != 1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x7a7,
             "ref_node_tet_quality","case not recognized");
      return 1;
    }
    uVar6 = ref_node_tet_vol(ref_node,nodes,local_348);
    if (uVar6 == 0) {
      if (local_348[0] <= ref_node->min_volume) {
        RVar17 = local_348[0] - ref_node->min_volume;
LAB_001298b8:
        *quality = RVar17;
        return 0;
      }
      local_358 = local_348[0];
      uStack_350 = 0;
      uVar6 = ref_node_ratio(ref_node,*nodes,nodes[1],local_118 + 0x18);
      if (uVar6 == 0) {
        uVar6 = ref_node_ratio(ref_node,*nodes,nodes[2],local_118 + 0x12);
        if (uVar6 == 0) {
          uVar6 = ref_node_ratio(ref_node,*nodes,nodes[3],local_118 + 0xc);
          if (uVar6 == 0) {
            uVar6 = ref_node_ratio(ref_node,nodes[1],nodes[2],local_118 + 6);
            if (uVar6 == 0) {
              uVar6 = ref_node_ratio(ref_node,nodes[1],nodes[3],local_118);
              if (uVar6 == 0) {
                uVar6 = ref_node_ratio(ref_node,nodes[2],nodes[3],&local_148);
                if (uVar6 == 0) {
                  iVar4 = *nodes;
                  pRVar5 = ref_node->real;
                  lVar8 = 0;
                  do {
                    local_198[lVar8] = pRVar5[iVar4 * 0xf + 3 + (int)lVar8];
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 6);
                  uVar6 = ref_matrix_det_m(local_198,local_388);
                  dVar19 = local_388[0];
                  if (uVar6 == 0) {
                    iVar4 = nodes[1];
                    pRVar5 = ref_node->real;
                    lVar8 = 0;
                    do {
                      local_198[lVar8] = pRVar5[iVar4 * 0xf + 3 + (int)lVar8];
                      lVar8 = lVar8 + 1;
                    } while (lVar8 != 6);
                    uVar6 = ref_matrix_det_m(local_198,local_388);
                    if (uVar6 == 0) {
                      local_368 = local_388[0];
                      iVar4 = nodes[2];
                      pRVar5 = ref_node->real;
                      lVar8 = 0;
                      do {
                        local_198[lVar8] = pRVar5[iVar4 * 0xf + 3 + (int)lVar8];
                        lVar8 = lVar8 + 1;
                      } while (lVar8 != 6);
                      uVar6 = ref_matrix_det_m(local_198,local_388);
                      if (uVar6 == 0) {
                        uVar11 = SUB84(dVar19,0);
                        uVar12 = (undefined4)((ulong)dVar19 >> 0x20);
                        if (local_368 <= dVar19) {
                          uVar11 = SUB84(local_368,0);
                          uVar12 = (undefined4)((ulong)local_368 >> 0x20);
                        }
                        local_368 = local_388[0];
                        iVar4 = nodes[3];
                        pRVar5 = ref_node->real;
                        lVar8 = 0;
                        do {
                          local_198[lVar8] = pRVar5[iVar4 * 0xf + 3 + (int)lVar8];
                          lVar8 = lVar8 + 1;
                        } while (lVar8 != 6);
                        uVar6 = ref_matrix_det_m(local_198,local_388);
                        if (uVar6 == 0) {
                          dVar19 = (double)CONCAT44(uVar12,uVar11);
                          if (local_368 <= (double)CONCAT44(uVar12,uVar11)) {
                            dVar19 = local_368;
                          }
                          if (local_388[0] <= dVar19) {
                            dVar19 = local_388[0];
                          }
                          if (dVar19 < 0.0) {
                            dVar19 = sqrt(dVar19);
                          }
                          else {
                            dVar19 = SQRT(dVar19);
                          }
                          dVar19 = pow(local_358 * dVar19,0.6666666666666666);
                          dVar13 = local_148 * local_148 +
                                   local_118[0] * local_118[0] +
                                   local_118[6] * local_118[6] +
                                   local_118[0xc] * local_118[0xc] +
                                   local_118[0x18] * local_118[0x18] +
                                   local_118[0x12] * local_118[0x12];
                          auVar16._0_8_ = dVar13 * 1e+20;
                          auVar16._8_8_ = dVar19;
                          auVar18._0_8_ = -auVar16._0_8_;
                          auVar18._8_8_ = -dVar19;
                          auVar16 = maxpd(auVar16,auVar18);
                          uVar10 = -(ulong)(auVar16._8_8_ < auVar16._0_8_);
                          RVar17 = (REF_DBL)(~uVar10 & 0xbff0000000000000 |
                                            (ulong)((dVar19 * 24.9610058766228) / dVar13) & uVar10);
                          goto LAB_001298b8;
                        }
                        pcVar9 = "n3";
                        uVar7 = 0x693;
                      }
                      else {
                        pcVar9 = "n2";
                        uVar7 = 0x68f;
                      }
                    }
                    else {
                      pcVar9 = "n1";
                      uVar7 = 0x68b;
                    }
                  }
                  else {
                    pcVar9 = "n0";
                    uVar7 = 0x687;
                  }
                }
                else {
                  pcVar9 = "l5";
                  uVar7 = 0x684;
                }
              }
              else {
                pcVar9 = "l4";
                uVar7 = 0x683;
              }
            }
            else {
              pcVar9 = "l3";
              uVar7 = 0x682;
            }
          }
          else {
            pcVar9 = "l2";
            uVar7 = 0x681;
          }
        }
        else {
          pcVar9 = "l1";
          uVar7 = 0x680;
        }
      }
      else {
        pcVar9 = "l0";
        uVar7 = 0x67f;
      }
    }
    else {
      pcVar9 = "vol";
      uVar7 = 0x678;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar7,
           "ref_node_tet_epic_quality",(ulong)uVar6,pcVar9);
    pcVar9 = "epic";
    uVar7 = 0x7a1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar7,
         "ref_node_tet_quality",(ulong)uVar6,pcVar9);
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_node_tet_quality(REF_NODE ref_node, REF_INT *nodes,
                                        REF_DBL *quality) {
  switch (ref_node->tet_quality) {
    case REF_NODE_EPIC_QUALITY:
      RSS(ref_node_tet_epic_quality(ref_node, nodes, quality), "epic");
      break;
    case REF_NODE_JAC_QUALITY:
      RSS(ref_node_tet_jac_quality(ref_node, nodes, quality), "jac");
      break;
    default:
      THROW("case not recognized");
  }
  return REF_SUCCESS;
}